

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aprog.c
# Opt level: O3

void tick_prog_ilopheth(AREA_DATA_conflict *area)

{
  CHAR_DATA *ch;
  ROOM_INDEX_DATA *pRVar1;
  ROOM_INDEX_DATA *pRoomIndex;
  char *pcVar2;
  OBJ_DATA *obj;
  OBJ_INDEX_DATA *pOVar3;
  OBJ_DATA *pOVar4;
  CHAR_DATA **args_1;
  int local_12cc;
  void *local_12c8;
  void *local_12c0;
  string local_12b8;
  string local_1298;
  string local_1278;
  string local_1258;
  char buf [4608];
  
  pRVar1 = get_room_index(0);
  pRoomIndex = get_room_index(0);
  if ((time_info.day != 0xe) && (time_info.day != 0)) {
    return;
  }
  if ((time_info.hour != 0x11) && (time_info.hour != 0xf)) {
    return;
  }
  if (time_info.half != false) {
    return;
  }
  if (1 < area->sky) {
    return;
  }
  pOVar4 = pRVar1->contents;
  while( true ) {
    if (pOVar4 == (OBJ_DATA *)0x0) {
      return;
    }
    if (pOVar4->pIndexData->vnum == 0x2337) break;
    pOVar4 = pOVar4->next_content;
  }
  for (pOVar4 = pOVar4->contains; pOVar4 != (OBJ_DATA *)0x0; pOVar4 = pOVar4->next_content) {
    if (pOVar4->pIndexData->vnum == 0x2338) {
      if (time_info.hour == 0xf) {
        if (pRVar1->people != (CHAR_DATA *)0x0) {
          args_1 = &pRVar1->people;
          pcVar2 = get_char_color(pRVar1->people,"yellow");
          END_COLOR(*args_1);
          sprintf(buf,
                  "%sAs the afternoon sun drops lower in the sky a single shaft of sunlight shines through a gap in the stones, coming to rest directly on the white marble pedestal.%s"
                  ,pcVar2);
          act(buf,*args_1,(void *)0x0,(void *)0x0,4);
          local_1258._M_dataplus._M_p = (pointer)&local_1258.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1258,"tick_prog_ilopheth","");
          local_1298._M_dataplus._M_p = (pointer)&local_1298.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1298,"act_queue","");
          local_12c0 = (void *)0x0;
          local_12c8 = (void *)0x0;
          local_12cc = 4;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[92],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (&RS.Queue,4,&local_1258,&local_1298,act_queue,
                     (char (*) [92])
                     "The opacity of the crystal sphere appears to fade, and it begins to glow a brilliant white!"
                     ,args_1,&local_12c0,&local_12c8,&local_12cc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1298._M_dataplus._M_p != &local_1298.field_2) {
            operator_delete(local_1298._M_dataplus._M_p,local_1298.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1258._M_dataplus._M_p != &local_1258.field_2) {
            operator_delete(local_1258._M_dataplus._M_p,local_1258.field_2._M_allocated_capacity + 1
                           );
          }
          local_1278._M_dataplus._M_p = (pointer)&local_1278.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1278,"tick_prog_ilopheth","");
          local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b8,"act_queue","");
          local_12c0 = (void *)0x0;
          local_12c8 = (void *)0x0;
          local_12cc = 4;
          CQueue::
          AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[87],char_data*&,decltype(nullptr),decltype(nullptr),int>
                    (&RS.Queue,7,&local_1278,&local_12b8,act_queue,
                     (char (*) [87])
                     "To the northwest, an immense pillar of light ascends from the forest into the heavens!"
                     ,args_1,&local_12c0,&local_12c8,&local_12cc);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
            operator_delete(local_12b8._M_dataplus._M_p,local_12b8.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1278._M_dataplus._M_p != &local_1278.field_2) {
            operator_delete(local_1278._M_dataplus._M_p,local_1278.field_2._M_allocated_capacity + 1
                           );
          }
        }
        pOVar4 = pRoomIndex->contents;
        while( true ) {
          if (pOVar4 == (OBJ_DATA *)0x0) {
            return;
          }
          if (pOVar4->pIndexData->vnum == 0x2331) break;
          pOVar4 = pOVar4->next_content;
        }
        ch = pRoomIndex->people;
        if (ch != (CHAR_DATA *)0x0) {
          memcpy(buf,
                 "The mass of energy begins to glow a brilliant white, and releases an immense pillar of energy which streaks into the heavens.  The disturbance seems to stabilize into an arched, opalescent portal."
                 ,0xc5);
          act(buf,ch,(void *)0x0,(void *)0x0,4);
        }
        obj_from_room(pOVar4);
        extract_obj(pOVar4);
        pOVar3 = get_obj_index(0);
        pOVar4 = create_object(pOVar3,0);
        obj_to_room(pOVar4,pRoomIndex);
        goto LAB_002ff699;
      }
      goto LAB_002ff696;
    }
  }
  if ((time_info.hour == 0xf) && (pRVar1->people != (CHAR_DATA *)0x0)) {
    pcVar2 = get_char_color(pRVar1->people,"yellow");
    END_COLOR(pRVar1->people);
    pOVar4 = (OBJ_DATA *)0x0;
    sprintf(buf,
            "%sAs the afternoon sun drops lower in the sky a single shaft of sunlight shines through a gap in the stones, coming to rest directly on the white marble pedestal.%s"
            ,pcVar2);
    act(buf,pRVar1->people,(void *)0x0,(void *)0x0,4);
  }
  else {
LAB_002ff696:
    pOVar4 = (OBJ_DATA *)0x0;
  }
LAB_002ff699:
  if (time_info.hour == 0x11) {
    if (pRVar1->people != (CHAR_DATA *)0x0) {
      act("As the sun descends toward the horizon, the shaft of light illuminating the pedestal fades to a spot, and disappears."
          ,pRVar1->people,(void *)0x0,(void *)0x0,4);
    }
    for (obj = pRoomIndex->contents; obj != (OBJ_DATA *)0x0; obj = obj->next_content) {
      if (obj->pIndexData->vnum == 0x2330) goto LAB_002ff6ea;
    }
    obj = pOVar4;
    if (pOVar4 != (OBJ_DATA *)0x0) {
LAB_002ff6ea:
      if (pRoomIndex->people != (CHAR_DATA *)0x0) {
        act("The opalescent gateway begins to break down, its edges flexing and twisting wildly.",
            pRoomIndex->people,(void *)0x0,(void *)0x0,4);
      }
      obj_from_room(obj);
      extract_obj(obj);
      pOVar3 = get_obj_index(0);
      pOVar4 = create_object(pOVar3,0);
      obj_to_room(pOVar4,pRoomIndex);
    }
  }
  return;
}

Assistant:

void tick_prog_ilopheth(AREA_DATA *area)
{
	OBJ_DATA *pedestal = nullptr, *sphere = nullptr, *old_portal = nullptr, *new_portal = nullptr, *obj;
	ROOM_INDEX_DATA *pedroom = get_room_index(9096);
	ROOM_INDEX_DATA *portroom = get_room_index(9114);
	char buf[MSL];
	bool sph_found = false;

	if (time_info.day != 0 && time_info.day != 14)
		return;

	if ((time_info.hour != 15 && time_info.hour != 17) || time_info.half)
		return;

	if (area->sky >= WeatherCondition::Overcast)
		return;

	for (obj = pedroom->contents; obj; obj = obj->next_content)
	{
		if (obj->pIndexData->vnum == 9015)
		{
			pedestal = obj;
			break;
		}
	}

	if (!pedestal)
		return;

	for (obj = pedestal->contains; obj; obj = obj->next_content)
	{
		if (obj->pIndexData->vnum == 9016)
		{
			sphere = obj;
			sph_found = true;
			break;
		}
	}

	if (time_info.hour == 15)
	{
		if (!sph_found)
		{
			if (pedroom->people)
			{
				sprintf(buf, "%sAs the afternoon sun drops lower in the sky a single shaft of sunlight shines through a gap in the stones, coming to rest directly on the white marble pedestal.%s",
					get_char_color(pedroom->people, "yellow"),
					END_COLOR(pedroom->people));
				act(buf, pedroom->people, 0, 0, TO_ALL);
			}
		}
		else
		{
			if (pedroom->people)
			{
				sprintf(buf, "%sAs the afternoon sun drops lower in the sky a single shaft of sunlight shines through a gap in the stones, coming to rest directly on the white marble pedestal.%s",
					get_char_color(pedroom->people, "yellow"),
					END_COLOR(pedroom->people));
				act(buf, pedroom->people, 0, 0, TO_ALL);

				RS.Queue.AddToQueue(4, "tick_prog_ilopheth", "act_queue", act_queue, "The opacity of the crystal sphere appears to fade, and it begins to glow a brilliant white!", pedroom->people, nullptr, nullptr, TO_ALL);
				RS.Queue.AddToQueue(7, "tick_prog_ilopheth", "act_queue", act_queue, "To the northwest, an immense pillar of light ascends from the forest into the heavens!", pedroom->people, nullptr, nullptr, TO_ALL);
			}

			for (obj = portroom->contents; obj; obj = obj->next_content)
			{
				if (obj->pIndexData->vnum == 9009)
				{
					old_portal = obj;
					break;
				}
			}

			if (!old_portal)
			{
				return;
			}
			else
			{
				if (portroom->people)
				{
					sprintf(buf, "The mass of energy begins to glow a brilliant white, and releases an immense pillar of energy which streaks into the heavens.  The disturbance seems to stabilize into an arched, opalescent portal.");
					act(buf, portroom->people, 0, 0, TO_ALL);
				}

				obj_from_room(old_portal);
				extract_obj(old_portal);

				new_portal = create_object(get_obj_index(9008), 0);

				obj_to_room(new_portal, portroom);
			}
		}
	}

	if (time_info.hour == 17)
	{
		if (pedroom->people)
			act("As the sun descends toward the horizon, the shaft of light illuminating the pedestal fades to a spot, and disappears.", pedroom->people, 0, 0, TO_ALL);

		for (obj = portroom->contents; obj; obj = obj->next_content)
		{
			if (obj->pIndexData->vnum == 9008)
			{
				new_portal = obj;
				break;
			}
		}

		if (!new_portal)
		{
			return;
		}
		else
		{
			if (portroom->people)
				act("The opalescent gateway begins to break down, its edges flexing and twisting wildly.", portroom->people, 0, 0, TO_ALL);

			obj_from_room(new_portal);
			extract_obj(new_portal);

			old_portal = create_object(get_obj_index(9009), 0);

			obj_to_room(old_portal, portroom);
		}
	}
}